

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextDiagnosticClient.cpp
# Opt level: O2

void __thiscall
slang::SourceSnippet::printTo(SourceSnippet *this,FormatBuffer *out,terminal_color highlightColor)

{
  size_type sVar1;
  size_type __n;
  char *begin;
  color_type cVar2;
  pointer ppVar3;
  size_type __pos;
  long lVar4;
  basic_string_view<char,_std::char_traits<char>_> bVar5;
  string_view str;
  text_style local_68;
  FormatBuffer *local_50;
  SourceSnippet *local_48;
  string_view view;
  
  ::fmt::v11::detail::buffer<char>::append<char>((buffer<char> *)out,"\n","");
  sVar1 = (this->invalidRanges).super_SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_>.len;
  if (sVar1 == 0) {
    begin = (this->snippetLine)._M_dataplus._M_p;
    ::fmt::v11::detail::buffer<char>::append<char>
              ((buffer<char> *)out,begin,begin + (this->snippetLine)._M_string_length);
  }
  else {
    view._M_str = (this->snippetLine)._M_dataplus._M_p;
    view._M_len = (this->snippetLine)._M_string_length;
    ppVar3 = (this->invalidRanges).super_SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_>.
             data_;
    __pos = 0;
    local_50 = out;
    local_48 = this;
    for (lVar4 = sVar1 << 4; lVar4 != 0; lVar4 = lVar4 + -0x10) {
      sVar1 = ppVar3->first;
      __n = ppVar3->second;
      bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        (&view,__pos,sVar1 - __pos);
      ::fmt::v11::detail::buffer<char>::append<char>
                ((buffer<char> *)out,bVar5._M_str,bVar5._M_str + bVar5._M_len);
      cVar2 = local_68.foreground_color;
      local_68.foreground_color._0_4_ = local_68.foreground_color._0_4_ & 0xffffff00;
      local_68.foreground_color.value.rgb_color._1_3_ = cVar2.value._1_3_;
      local_68.foreground_color.value.term_color = 0;
      local_68.background_color.is_rgb = false;
      local_68.background_color.value.term_color = '\0';
      local_68.set_foreground_color = false;
      local_68.set_background_color = false;
      local_68.ems = reverse;
      bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::substr(&view,sVar1,__n);
      FormatBuffer::append(out,&local_68,bVar5);
      __pos = __n + sVar1;
      ppVar3 = ppVar3 + 1;
    }
    bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (&view,__pos,0xffffffffffffffff);
    out = local_50;
    ::fmt::v11::detail::buffer<char>::append<char>
              ((buffer<char> *)local_50,bVar5._M_str,bVar5._M_str + bVar5._M_len);
    this = local_48;
  }
  ::fmt::v11::detail::buffer<char>::append<char>((buffer<char> *)out,"\n","");
  local_68.foreground_color = (color_type)((ulong)highlightColor << 0x20);
  local_68.background_color.is_rgb = false;
  local_68.background_color.value.term_color = '\0';
  local_68.ems = ~(strikethrough|conceal|reverse|blink|underline|italic|faint|bold);
  local_68.set_foreground_color = true;
  local_68.set_background_color = false;
  str._M_str = (this->highlightLine)._M_dataplus._M_p;
  str._M_len = (this->highlightLine)._M_string_length;
  FormatBuffer::append(out,&local_68,str);
  return;
}

Assistant:

void printTo(FormatBuffer& out, fmt::terminal_color highlightColor) {
        out.append("\n");

        if (invalidRanges.empty()) {
            out.append(snippetLine);
        }
        else {
            size_t index = 0;
            std::string_view view = snippetLine;
            for (auto [start, count] : invalidRanges) {
                SLANG_ASSERT(start >= index);
                out.append(view.substr(index, start - index));

                out.append(fmt::emphasis::reverse, view.substr(start, count));
                index = start + count;
            }

            out.append(view.substr(index));
        }

        out.append("\n");
        out.append(fg(highlightColor), highlightLine);
    }